

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O2

FT_UShort FT_Stream_ReadUShortLE(FT_Stream stream,FT_Error *error)

{
  FT_UShort FVar1;
  unsigned_long uVar2;
  FT_UShort *pFVar3;
  FT_Byte reads [2];
  
  *error = 0;
  uVar2 = stream->pos;
  if (stream->size <= uVar2 + 1) {
LAB_00137a00:
    *error = 0x55;
    return 0;
  }
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->base == (uchar *)0x0) {
      FVar1 = 0;
      goto LAB_00137a1e;
    }
    pFVar3 = (FT_UShort *)(stream->base + uVar2);
  }
  else {
    pFVar3 = (FT_UShort *)reads;
    uVar2 = (*stream->read)(stream,uVar2,(uchar *)pFVar3,2);
    if (uVar2 != 2) goto LAB_00137a00;
    uVar2 = stream->pos;
  }
  FVar1 = *pFVar3;
LAB_00137a1e:
  stream->pos = uVar2 + 2;
  return FVar1;
}

Assistant:

FT_BASE_DEF( FT_UShort )
  FT_Stream_ReadUShortLE( FT_Stream  stream,
                          FT_Error*  error )
  {
    FT_Byte    reads[2];
    FT_Byte*   p      = 0;
    FT_UShort  result = 0;


    FT_ASSERT( stream );

    *error = FT_Err_Ok;

    if ( stream->pos + 1 < stream->size )
    {
      if ( stream->read )
      {
        if ( stream->read( stream, stream->pos, reads, 2L ) != 2L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_USHORT_LE( p );
    }
    else
      goto Fail;

    stream->pos += 2;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadUShortLE:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return 0;
  }